

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int UnixFile_Seek(void *pUserData,jx9_int64 iOfft,int whence)

{
  __off_t _Var1;
  
  if (whence != 1) {
    whence = (uint)(whence == 2) * 2;
  }
  _Var1 = lseek((int)pUserData,iOfft,whence);
  return (int)(_Var1 >> 0x3f);
}

Assistant:

static int UnixFile_Seek(void *pUserData, jx9_int64 iOfft, int whence)
{
	off_t iNew;
	switch(whence){
	case 1:/*SEEK_CUR*/
		whence = SEEK_CUR;
		break;
	case 2: /* SEEK_END */
		whence = SEEK_END;
		break;
	case 0: /* SEEK_SET */
	default:
		whence = SEEK_SET;
		break;
	}
	iNew = lseek(SX_PTR_TO_INT(pUserData), (off_t)iOfft, whence);
	if( iNew < 0 ){
		return -1;
	}
	return JX9_OK;
}